

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ptrlist.c
# Opt level: O0

PtrListIterator *
raviX_ptrlist_reverse_iterator(PtrListIterator *__return_storage_ptr__,PtrList *head)

{
  int local_2c;
  PtrList *local_28;
  PtrList *head_local;
  
  if (head == (PtrList *)0x0) {
    local_28 = (PtrList *)0x0;
  }
  else {
    local_28 = head->prev_;
  }
  __return_storage_ptr__->__list = local_28;
  __return_storage_ptr__->__head = local_28;
  if (__return_storage_ptr__->__head == (PtrList *)0x0) {
    local_2c = 0;
  }
  else {
    local_2c = (int)(short)(char)*(undefined2 *)__return_storage_ptr__->__head;
  }
  __return_storage_ptr__->__nr = local_2c;
  return __return_storage_ptr__;
}

Assistant:

PtrListIterator raviX_ptrlist_reverse_iterator(PtrList *head)
{
	PtrListIterator iter;
	iter.__head = iter.__list = head ? head->prev_ : NULL;
	iter.__nr = iter.__head ? iter.__head->nr_ : 0;
	return iter;
}